

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<capnp::DynamicList::Reader&>(StringTree *__return_storage_ptr__,kj *this,Reader *params)

{
  size_t local_48;
  char *local_40;
  size_t sStack_38;
  ArrayDisposer *local_30;
  Branch *local_28;
  size_t sStack_20;
  ArrayDisposer *local_18;
  
  capnp::operator*(&local_48);
  __return_storage_ptr__->size_ = local_48;
  (__return_storage_ptr__->text).content.ptr = local_40;
  (__return_storage_ptr__->text).content.size_ = sStack_38;
  (__return_storage_ptr__->text).content.disposer = local_30;
  (__return_storage_ptr__->branches).ptr = local_28;
  (__return_storage_ptr__->branches).size_ = sStack_20;
  (__return_storage_ptr__->branches).disposer = local_18;
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}